

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::storage_moved_alert::storage_moved_alert
          (storage_moved_alert *this,stack_allocator *alloc,torrent_handle *h,string_view p)

{
  string_view str;
  allocation_slot aVar1;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  storage_moved_alert *this_local;
  string_view p_local;
  
  p_local.ptr_ = (char *)p.len_;
  this_local = (storage_moved_alert *)p.ptr_;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert =
       (_func_int **)&PTR__storage_moved_alert_00990d18;
  str.len_ = (size_t)p_local.ptr_;
  str.ptr_ = (char *)this_local;
  aVar1 = libtorrent::aux::stack_allocator::copy_string(alloc,str);
  (this->m_path_idx).m_idx = aVar1.m_idx;
  boost::basic_string_view::operator_cast_to_string(&this->path,(basic_string_view *)&this_local);
  return;
}

Assistant:

storage_moved_alert::storage_moved_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, string_view p)
		: torrent_alert(alloc, h)
		, m_path_idx(alloc.copy_string(p))
#if TORRENT_ABI_VERSION == 1
		, path(p)
#endif
	{}